

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_xmlmodelserialiser.cpp
# Opt level: O0

void __thiscall tst_XmlModelSerialiser::basicSaveLoadNested(tst_XmlModelSerialiser *this)

{
  QAbstractItemModel *a;
  QAbstractItemModel *b;
  byte bVar1;
  int iVar2;
  undefined8 *puVar3;
  int __oflag;
  char *__file;
  QModelIndex local_e8;
  QModelIndex local_d0;
  QXmlStreamReader local_b8 [8];
  QXmlStreamReader readNestedStream;
  QString local_98;
  undefined1 local_80 [8];
  QXmlStreamWriter writeNestedStream;
  QTemporaryFile local_70 [8];
  QTemporaryFile serialisedXmlNested;
  XmlModelSerialiser local_50 [8];
  XmlModelSerialiser serialiser;
  QAbstractItemModel *destinationModel;
  QAbstractItemModel *sourceModel;
  tst_XmlModelSerialiser *this_local;
  char16_t *str;
  
  iVar2 = qMetaTypeId<QAbstractItemModel_const*>();
  puVar3 = (undefined8 *)QTest::qData("sourceModel",iVar2);
  a = (QAbstractItemModel *)*puVar3;
  iVar2 = qMetaTypeId<QAbstractItemModel*>();
  puVar3 = (undefined8 *)QTest::qData("destinationModel",iVar2);
  b = (QAbstractItemModel *)*puVar3;
  XmlModelSerialiser::XmlModelSerialiser(local_50,a,(QObject *)0x0);
  __file = (char *)0x101;
  AbstractModelSerialiser::addRoleToSave((int)local_50);
  QTemporaryFile::QTemporaryFile(local_70);
  iVar2 = QTemporaryFile::open(local_70,__file,__oflag);
  bVar1 = QTest::qVerify((bool)((byte)iVar2 & 1),"serialisedXmlNested.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                         ,0x49);
  if ((bVar1 & 1) != 0) {
    QXmlStreamWriter::QXmlStreamWriter((QXmlStreamWriter *)local_80,(QIODevice *)local_70);
    QXmlStreamWriter::writeStartDocument();
    QArrayDataPointer<char16_t>::QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&readNestedStream,(Data *)0x0,L"NestForModel",0xc);
    QString::QString(&local_98,(DataPointer *)&readNestedStream);
    QXmlStreamWriter::writeStartElement((QString *)local_80);
    QString::~QString(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&readNestedStream);
    XmlModelSerialiser::setPrintStartDocument(SUB81(local_50,0));
    bVar1 = XmlModelSerialiser::saveModel((QXmlStreamWriter *)local_50);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialiser.saveModel(writeNestedStream)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                           ,0x4e);
    if ((bVar1 & 1) != 0) {
      QXmlStreamWriter::writeEndElement();
      bVar1 = QFileDevice::seek((longlong)local_70);
      bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialisedXmlNested.seek(0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                             ,0x50);
      if ((bVar1 & 1) != 0) {
        QXmlStreamReader::QXmlStreamReader(local_b8,(QIODevice *)local_70);
        AbstractModelSerialiser::setModel((QAbstractItemModel *)local_50);
        bVar1 = XmlModelSerialiser::loadModel((QXmlStreamReader *)local_50);
        bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialiser.loadModel(readNestedStream)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                               ,0x53);
        if ((bVar1 & 1) != 0) {
          QFileDevice::close();
          QModelIndex::QModelIndex(&local_d0);
          QModelIndex::QModelIndex(&local_e8);
          tst_SerialiserCommon::checkModelEqual
                    (&this->super_tst_SerialiserCommon,a,b,&local_d0,&local_e8,true);
          QObject::deleteLater();
        }
        QXmlStreamReader::~QXmlStreamReader(local_b8);
      }
    }
    QXmlStreamWriter::~QXmlStreamWriter((QXmlStreamWriter *)local_80);
  }
  QTemporaryFile::~QTemporaryFile(local_70);
  XmlModelSerialiser::~XmlModelSerialiser(local_50);
  return;
}

Assistant:

void tst_XmlModelSerialiser::basicSaveLoadNested()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    XmlModelSerialiser serialiser(sourceModel, nullptr);
    serialiser.addRoleToSave(Qt::UserRole + 1);
    QTemporaryFile serialisedXmlNested;
    QVERIFY(serialisedXmlNested.open());
    QXmlStreamWriter writeNestedStream(&serialisedXmlNested);
    writeNestedStream.writeStartDocument();
    writeNestedStream.writeStartElement(QStringLiteral("NestForModel"));
    serialiser.setPrintStartDocument(false);
    QVERIFY(serialiser.saveModel(writeNestedStream));
    writeNestedStream.writeEndElement(); // NestForModel
    QVERIFY(serialisedXmlNested.seek(0));
    QXmlStreamReader readNestedStream(&serialisedXmlNested);
    serialiser.setModel(destinationModel);
    QVERIFY(serialiser.loadModel(readNestedStream));
    serialisedXmlNested.close();
    checkModelEqual(sourceModel, destinationModel);
    destinationModel->deleteLater();
}